

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall r_exec::View::force_res(View *this,double value)

{
  Atom *this_00;
  Atom local_1c [4];
  double local_18;
  double value_local;
  View *this_local;
  
  local_18 = value;
  value_local = (double)this;
  r_code::Atom::Float((float)value);
  this_00 = r_code::View::code(&this->super_View,4);
  r_code::Atom::operator=(this_00,local_1c);
  r_code::Atom::~Atom(local_1c);
  return;
}

Assistant:

void View::force_res(double value)
{
    code(VIEW_RES) = Atom::Float(value);
}